

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tokenizer.cpp
# Opt level: O0

void __thiscall tokenizer::read_invalid_token(tokenizer *this)

{
  bool bVar1;
  tokenizer *this_local;
  
  this->last_position_number = this->position_number;
  this->last_line_number = this->line_number;
  while( true ) {
    bVar1 = true;
    if ((*this->line_char == '\0') && (bVar1 = true, *this->line_char == ' ')) {
      bVar1 = *this->line_char != '\t';
    }
    if (!bVar1) break;
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator+=
              (&this->current_word,*this->line_char);
    advance_to_next_character(this);
  }
  add_token_to_stream(this,invalid);
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
            (&this->current_word,"");
  return;
}

Assistant:

void tokenizer::read_invalid_token() {
    last_position_number = position_number;
    last_line_number = line_number;

    while(*line_char != '\0' || *line_char != ' ' || *line_char != '\t') {
        current_word += *line_char;
        this->advance_to_next_character();
    }

    this->add_token_to_stream(Token_Type::invalid);
    //position_number += current_word.length();
    current_word = "";
}